

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O0

unsigned_long QIntC::IntConverter<char,_unsigned_long,_true,_false>::convert(char *i)

{
  byte bVar1;
  unsigned_long uVar2;
  type ii;
  char *i_local;
  
  bVar1 = *i;
  if (-1 < *i) {
    uVar2 = std::numeric_limits<unsigned_long>::max();
    if (bVar1 <= uVar2) goto LAB_003ba3e6;
  }
  error(*i);
LAB_003ba3e6:
  return (long)*i;
}

Assistant:

inline static To
        convert(From const& i)
        {
            // From is signed, and To is unsigned. If i > 0, it's safe to
            // convert it to the corresponding unsigned type and to
            // compare with To's max.
            auto ii = static_cast<typename to_u<From>::type>(i);
            if ((i < 0) || (ii > std::numeric_limits<To>::max())) {
                error(i);
            }
            return static_cast<To>(i);
        }